

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
pbrt::
returnArray<float,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,float(*)(float_const*,pbrt::FileLoc_const*)>
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *values,ParsedParameter *param,
          int nPerItem,_func_float_float_ptr_FileLoc_ptr *convert)

{
  bool bVar1;
  size_t sVar2;
  allocator_type *paVar3;
  const_reference pvVar4;
  reference pvVar5;
  int in_ECX;
  long in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  code *in_R8;
  value_type vVar6;
  size_t i;
  size_t n;
  vector<float,_std::allocator<float>_> *v;
  undefined1 *__n;
  vector<float,_std::allocator<float>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  FileLoc *in_stack_ffffffffffffffd0;
  allocator_type *paVar7;
  
  this = in_RDI;
  bVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::empty
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x94f5c9);
  if (bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
  if (sVar2 % (ulong)(long)in_ECX == 0) {
    *(undefined1 *)(in_RDX + 0xd8) = 1;
    sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
    paVar3 = (allocator_type *)(sVar2 / (ulong)(long)in_ECX);
    __n = &stack0xffffffffffffffce;
    paVar7 = paVar3;
    std::allocator<float>::allocator((allocator<float> *)0x94f66d);
    std::vector<float,_std::allocator<float>_>::vector(this,(size_type)__n,paVar3);
    std::allocator<float>::~allocator((allocator<float> *)0x94f68d);
    for (paVar3 = (allocator_type *)0x0; paVar3 < paVar7; paVar3 = paVar3 + 1) {
      pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (in_RSI,(long)in_ECX * (long)paVar3);
      vVar6 = (value_type)(*in_R8)(pvVar4,in_RDX + 0x40);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this,(size_type)paVar3);
      *pvVar5 = vVar6;
    }
    return in_RDI;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffffd0,
             (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}